

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O2

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddAPPPacket
          (RTCPCompoundPacketBuilder *this,uint8_t subtype,uint32_t ssrc,uint8_t *name,void *appdata
          ,size_t appdatalen)

{
  size_t numbytes;
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  ushort uVar6;
  value_type local_40;
  
  if (this->arebuilding == true) {
    if (subtype < 0x20) {
      if ((appdatalen & 3) == 0) {
        if (appdatalen < 0x3fff5) {
          numbytes = appdatalen + 0xc;
          sVar1 = this->appsize;
          sVar2 = this->byesize;
          sVar4 = SDES::NeededBytes(&this->sdes);
          sVar5 = Report::NeededBytes(&this->report);
          if (this->maximumpacketsize < sVar5 + sVar4 + sVar1 + numbytes + sVar2) {
            iVar3 = -0x2b;
          }
          else {
            local_40.packetdata =
                 (uint8_t *)
                 operator_new__(numbytes,(this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr,
                                3);
            if (local_40.packetdata == (byte *)0x0) {
              iVar3 = -1;
            }
            else {
              *local_40.packetdata = subtype | 0x80;
              uVar6 = (short)(appdatalen >> 2) + 2;
              *(ushort *)(local_40.packetdata + 2) = uVar6 * 0x100 | uVar6 >> 8;
              local_40.packetdata[1] = 0xcc;
              *(uint32_t *)(local_40.packetdata + 4) =
                   ssrc >> 0x18 | (ssrc & 0xff0000) >> 8 | (ssrc & 0xff00) << 8 | ssrc << 0x18;
              local_40.packetdata[8] = *name;
              local_40.packetdata[9] = name[1];
              local_40.packetdata[10] = name[2];
              local_40.packetdata[0xb] = name[3];
              if (appdatalen != 0) {
                memcpy(local_40.packetdata + 0xc,appdata,appdatalen);
              }
              local_40.packetlength = numbytes;
              std::__cxx11::
              list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
              ::push_back(&this->apppackets,&local_40);
              this->appsize = this->appsize + numbytes;
              iVar3 = 0;
            }
          }
        }
        else {
          iVar3 = -0x22;
        }
      }
      else {
        iVar3 = -0x24;
      }
    }
    else {
      iVar3 = -0x25;
    }
    return iVar3;
  }
  return -0x2a;
}

Assistant:

int RTCPCompoundPacketBuilder::AddAPPPacket(uint8_t subtype,uint32_t ssrc,const uint8_t name[4],const void *appdata,size_t appdatalen)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (subtype > 31)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ILLEGALSUBTYPE;
	if ((appdatalen%4) != 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ILLEGALAPPDATALENGTH;

	size_t appdatawords = appdatalen/4;

	if ((appdatawords+2) > 65535)
		return ERR_RTP_RTCPCOMPPACKBUILDER_APPDATALENTOOBIG;
	
	size_t packsize = sizeof(RTCPCommonHeader)+sizeof(uint32_t)*2+appdatalen;
#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = appsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#else
	size_t totalotherbytes = appsize+unknownsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	if ((totalotherbytes + packsize) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf;
	
	buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPAPPPACKET) uint8_t[packsize];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;

	RTCPCommonHeader *hdr = (RTCPCommonHeader *)buf;

	hdr->version = 2;
	hdr->padding = 0;
	hdr->count = subtype;
	
	hdr->length = htons((uint16_t)(appdatawords+2));
	hdr->packettype = RTP_RTCPTYPE_APP;
	
	uint32_t *source = (uint32_t *)(buf+sizeof(RTCPCommonHeader));
	*source = htonl(ssrc);

	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+0] = name[0];
	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+1] = name[1];
	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+2] = name[2];
	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+3] = name[3];

	if (appdatalen > 0)
		memcpy((buf+sizeof(RTCPCommonHeader)+sizeof(uint32_t)*2),appdata,appdatalen);

	apppackets.push_back(Buffer(buf,packsize));
	appsize += packsize;
	
	return 0;
}